

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauMerge.c
# Opt level: O0

void Dau_DsdRemoveBraces_rec(char *pStr,char **p,int *pMatches)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  char *local_50;
  char *pBeg;
  int fCompl;
  char *q_1;
  char *q;
  int *pMatches_local;
  char **p_local;
  char *pStr_local;
  
  if (**p == '!') {
    *p = *p + 1;
  }
  while( true ) {
    if (((**p < 'A') || (bVar2 = true, 'F' < **p)) && (bVar2 = false, '/' < **p)) {
      bVar2 = **p < ':';
    }
    if (!bVar2) break;
    *p = *p + 1;
  }
  if ((**p == '<') && (pStr[(long)pMatches[(long)*p - (long)pStr] + 1] == '{')) {
    *p = pStr + (long)pMatches[(long)*p - (long)pStr] + 1;
  }
  if ((**p < 'a') || ('z' < **p)) {
    if ((**p != '(') && (((**p != '[' && (**p != '<')) && (**p != '{')))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                    ,0x228,"void Dau_DsdRemoveBraces_rec(char *, char **, int *)");
    }
    pcVar3 = pStr + pMatches[(long)*p - (long)pStr];
    if ((int)*pcVar3 != **p + 1 + (uint)(**p != '(')) {
      __assert_fail("*q == **p + 1 + (**p != \'(\')",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                    ,0x219,"void Dau_DsdRemoveBraces_rec(char *, char **, int *)");
    }
    *p = *p + 1;
    while (*p < pcVar3) {
      cVar1 = **p;
      if (cVar1 != '!') {
        local_50 = *p;
      }
      else {
        local_50 = *p + 1;
      }
      Dau_DsdRemoveBraces_rec(pStr,p,pMatches);
      if ((((cVar1 != '!') && (*local_50 == '(')) && (*pcVar3 == ')')) ||
         ((*local_50 == '[' && (*pcVar3 == ']')))) {
        if ((**p != ')') && (**p != ']')) {
          __assert_fail("**p == \')\' || **p == \']\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                        ,0x221,"void Dau_DsdRemoveBraces_rec(char *, char **, int *)");
        }
        **p = ' ';
        *local_50 = ' ';
      }
      *p = *p + 1;
    }
    if (*p != pcVar3) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                    ,0x225,"void Dau_DsdRemoveBraces_rec(char *, char **, int *)");
    }
  }
  return;
}

Assistant:

void Dau_DsdRemoveBraces_rec( char * pStr, char ** p, int * pMatches )
{
    if ( **p == '!' )
        (*p)++;
    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
        (*p)++;
    if ( **p == '<' )
    {
        char * q = pStr + pMatches[*p - pStr];
        if ( *(q+1) == '{' )
            *p = q+1;
    }
    if ( **p >= 'a' && **p <= 'z' ) // var
        return;
    if ( **p == '(' || **p == '[' || **p == '<' || **p == '{' ) 
    {
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            int fCompl = (**p == '!');
            char * pBeg = fCompl ? *p + 1 : *p;
            Dau_DsdRemoveBraces_rec( pStr, p, pMatches );
            if ( (!fCompl && *pBeg == '(' && *q == ')') || (*pBeg == '[' && *q == ']') )
            {
                assert( **p == ')' || **p == ']' );
                *pBeg = **p = ' ';
            }
        }
        assert( *p == q );
        return;
    }
    assert( 0 );
}